

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DramAnalyzer.hpp
# Opt level: O2

int DramAnalyzer::measure_time(char *a1,char *a2)

{
  undefined1 auVar1 [16];
  ulong in_RAX;
  long lVar2;
  long in_RDX;
  long lVar3;
  bool bVar4;
  
  rdtscp();
  lVar2 = 1000;
  lVar3 = in_RDX;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    lVar3 = CONCAT71((int7)((ulong)lVar3 >> 8),*a2);
    clflushopt(*a1);
    clflushopt(*a2);
  }
  rdtscp();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (in_RAX | lVar3 << 0x20) - (in_RDX << 0x20 | in_RAX);
  return SUB164(auVar1 / ZEXT816(1000),0);
}

Assistant:

static int inline measure_time(volatile char *a1, volatile char *a2) {
    uint64_t before, after;
    before = rdtscp();
    lfence();
    for (size_t i = 0; i < DRAMA_ROUNDS; i++) {
      (void)*a1;
      (void)*a2;
      clflushopt(a1);
      clflushopt(a2);
      mfence();
    }
    after = rdtscp();
    return (int) ((after - before)/DRAMA_ROUNDS);
  }